

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_EulerAngles.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::LE_EulerAngles::SetThetaInDegrees(LE_EulerAngles *this,KFIXED8_3 *Theta)

{
  KFIXED<char,_(unsigned_char)__x03_> local_48;
  KFIXED<char,_(unsigned_char)__x03_> local_38;
  KFIXED<char,_(unsigned_char)__x03_> local_28;
  KFIXED8_3 *local_18;
  KFIXED8_3 *Theta_local;
  LE_EulerAngles *this_local;
  
  local_18 = Theta;
  Theta_local = (KFIXED8_3 *)this;
  KFIXED<char,_(unsigned_char)'\x03'>::KFIXED(&local_48,Theta);
  UTILS::DegToRad<KDIS::DATA_TYPE::KFIXED<char,(unsigned_char)3>>(&local_38);
  KFIXED<char,_(unsigned_char)'\x03'>::operator=(&local_28,&this->m_Theta);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_28);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_38);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_48);
  return;
}

Assistant:

void LE_EulerAngles::SetThetaInDegrees( KFIXED8_3 Theta )
{
    m_Theta = DegToRad( Theta );
}